

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_layout_row_push(nk_context *ctx,float ratio_or_width)

{
  nk_panel_row_layout_type nVar1;
  nk_panel *pnVar2;
  float fVar3;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4564,"void nk_layout_row_push(struct nk_context *, float)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar2 = ctx->current->layout;
    if (pnVar2 == (nk_panel *)0x0) {
      __assert_fail("ctx->current->layout",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x4566,"void nk_layout_row_push(struct nk_context *, float)");
    }
    nVar1 = (pnVar2->row).type;
    if (nVar1 == NK_LAYOUT_DYNAMIC_ROW) {
      fVar3 = (pnVar2->row).filled;
      if (1.0 < fVar3 + ratio_or_width) {
        return;
      }
      if (ratio_or_width <= 0.0) {
        fVar3 = 1.0 - fVar3;
      }
      else {
        fVar3 = 1.0;
        if (ratio_or_width <= 1.0) {
          fVar3 = ratio_or_width;
        }
      }
    }
    else {
      fVar3 = ratio_or_width;
      if (nVar1 != NK_LAYOUT_STATIC_ROW) {
        __assert_fail("layout->row.type == NK_LAYOUT_STATIC_ROW || layout->row.type == NK_LAYOUT_DYNAMIC_ROW"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x456c,"void nk_layout_row_push(struct nk_context *, float)");
      }
    }
    (pnVar2->row).item_width = fVar3;
    return;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4565,"void nk_layout_row_push(struct nk_context *, float)");
}

Assistant:

NK_API void
nk_layout_row_push(struct nk_context *ctx, float ratio_or_width)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    NK_ASSERT(layout->row.type == NK_LAYOUT_STATIC_ROW || layout->row.type == NK_LAYOUT_DYNAMIC_ROW);
    if (layout->row.type != NK_LAYOUT_STATIC_ROW && layout->row.type != NK_LAYOUT_DYNAMIC_ROW)
        return;

    if (layout->row.type == NK_LAYOUT_DYNAMIC_ROW) {
        float ratio = ratio_or_width;
        if ((ratio + layout->row.filled) > 1.0f) return;
        if (ratio > 0.0f)
            layout->row.item_width = NK_SATURATE(ratio);
        else layout->row.item_width = 1.0f - layout->row.filled;
    } else layout->row.item_width = ratio_or_width;
}